

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O3

dgGoogol * __thiscall
dgGoogol::operator*(dgGoogol *__return_storage_ptr__,dgGoogol *this,dgGoogol *A)

{
  long lVar1;
  short sVar2;
  short sVar3;
  HaI32 j;
  HaI32 HVar4;
  long lVar5;
  ulong uVar6;
  dgGoogol *tmp;
  dgGoogol *this_00;
  ulong uVar7;
  ulong uVar8;
  HaI32 i;
  long lVar9;
  bool bVar10;
  HaU64 mantissaAcc [8];
  HaU64 mantissaScale [8];
  undefined1 local_a8 [64];
  undefined1 local_68 [64];
  
  if ((long)this->m_mantissa[0] < 0) {
    __assert_fail("hacd::HaI64 (m_mantissa[0]) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgGoogol.cpp"
                  ,0x117,"dgGoogol dgGoogol::operator*(const dgGoogol &) const");
  }
  if (-1 < (long)A->m_mantissa[0]) {
    if (A->m_mantissa[0] == 0 || this->m_mantissa[0] == 0) {
      dgGoogol(__return_storage_ptr__,0.0);
    }
    else {
      local_a8 = ZEXT864(0);
      lVar9 = 3;
      this_00 = __return_storage_ptr__;
      do {
        if (this->m_mantissa[lVar9] != 0) {
          local_68 = ZEXT1664(ZEXT816(0) << 0x40);
          this_00 = A;
          ScaleMantissa(A,(HaU64 *)(local_68 + lVar9 * 8),this->m_mantissa[lVar9]);
          lVar5 = 7;
          uVar7 = 0;
          do {
            lVar1 = lVar5 * 8;
            uVar8 = *(ulong *)(local_a8 + lVar5 * 8);
            uVar6 = *(ulong *)(local_68 + lVar1) + *(ulong *)(local_a8 + lVar5 * 8);
            *(ulong *)(local_a8 + lVar5 * 8) = uVar6 + uVar7;
            bVar10 = lVar5 != 0;
            lVar5 = lVar5 + -1;
            uVar7 = (ulong)(CARRY8(uVar6,uVar7) || CARRY8(*(ulong *)(local_68 + lVar1),uVar8));
          } while (bVar10);
        }
        bVar10 = lVar9 != 0;
        lVar9 = lVar9 + -1;
      } while (bVar10);
      HVar4 = LeadinZeros(this_00,local_a8._0_8_);
      lVar9 = 7;
      uVar7 = 0;
      do {
        uVar8 = *(ulong *)(local_a8 + lVar9 * 8) << ((ulong)(HVar4 - 2) & 0x3f) | uVar7;
        uVar7 = *(ulong *)(local_a8 + lVar9 * 8) >> ((ulong)(0x42 - HVar4) & 0x3f);
        *(ulong *)(local_a8 + lVar9 * 8) = uVar8;
        bVar10 = lVar9 != 0;
        lVar9 = lVar9 + -1;
      } while (bVar10);
      sVar2 = this->m_exponent;
      sVar3 = A->m_exponent;
      dgGoogol(__return_storage_ptr__);
      __return_storage_ptr__->m_sign = A->m_sign ^ this->m_sign;
      __return_storage_ptr__->m_exponent = (sVar2 - (short)HVar4) + sVar3 + 4;
      __return_storage_ptr__->m_mantissa[0] = local_a8._0_8_;
      __return_storage_ptr__->m_mantissa[1] = local_a8._8_8_;
      __return_storage_ptr__->m_mantissa[2] = local_a8._16_8_;
      __return_storage_ptr__->m_mantissa[3] = local_a8._24_8_;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("hacd::HaI64 (A.m_mantissa[0]) >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgGoogol.cpp"
                ,0x118,"dgGoogol dgGoogol::operator*(const dgGoogol &) const");
}

Assistant:

dgGoogol dgGoogol::operator* (const dgGoogol &A) const
{
	HACD_ASSERT (hacd::HaI64 (m_mantissa[0]) >= 0);
	HACD_ASSERT (hacd::HaI64 (A.m_mantissa[0]) >= 0);

	if (m_mantissa[0] && A.m_mantissa[0]) {
		hacd::HaU64 mantissaAcc[DG_GOOGOL_SIZE * 2];
		memset (mantissaAcc, 0, sizeof (mantissaAcc));
		for (hacd::HaI32 i = DG_GOOGOL_SIZE - 1; i >= 0; i --) {
			hacd::HaU64 a = m_mantissa[i];
			if (a) {
				hacd::HaU64 mantissaScale[2 * DG_GOOGOL_SIZE];
				memset (mantissaScale, 0, sizeof (mantissaScale));
				A.ScaleMantissa (&mantissaScale[i], a);

				hacd::HaU64 carrier = 0;
				for (hacd::HaI32 j = 2 * DG_GOOGOL_SIZE - 1; j >= 0; j --) {
					hacd::HaU64 m0 = mantissaAcc[j];
					hacd::HaU64 m1 = mantissaScale[j];
					mantissaAcc[j] = m0 + m1 + carrier;
					carrier = CheckCarrier (m0, m1) | CheckCarrier (m0 + m1, carrier);
				}
			}
		}
		
		hacd::HaU64 carrier = 0;
		hacd::HaI32 bits = LeadinZeros (mantissaAcc[0]) - 2;
		for (hacd::HaI32 i = 2 * DG_GOOGOL_SIZE - 1; i >= 0; i --) {
			hacd::HaU64 a = mantissaAcc[i];
			mantissaAcc[i] = (a << bits) | carrier;
			carrier = a >> (64 - bits);
		}

		hacd::HaI32 exp = m_exponent + A.m_exponent - (bits - 2);

		dgGoogol tmp;
		tmp.m_sign = m_sign ^ A.m_sign;
		tmp.m_exponent = hacd::HaI16 (exp);
		memcpy (tmp.m_mantissa, mantissaAcc, sizeof (m_mantissa));

		return tmp;
	} 
	return dgGoogol(0.0);
}